

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_table.cpp
# Opt level: O3

PhysicalIndex __thiscall
duckdb::DataTable::CreateOptimisticCollection
          (DataTable *this,ClientContext *context,
          unique_ptr<duckdb::RowGroupCollection,_std::default_delete<duckdb::RowGroupCollection>,_true>
          *collection)

{
  DuckTransaction *this_00;
  LocalStorage *this_01;
  PhysicalIndex PVar1;
  pointer *__ptr;
  _Head_base<0UL,_duckdb::RowGroupCollection_*,_false> local_18;
  
  this_00 = DuckTransaction::Get(context,this->db);
  this_01 = DuckTransaction::GetLocalStorage(this_00);
  local_18._M_head_impl =
       (collection->
       super_unique_ptr<duckdb::RowGroupCollection,_std::default_delete<duckdb::RowGroupCollection>_>
       )._M_t.
       super___uniq_ptr_impl<duckdb::RowGroupCollection,_std::default_delete<duckdb::RowGroupCollection>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::RowGroupCollection_*,_std::default_delete<duckdb::RowGroupCollection>_>
       .super__Head_base<0UL,_duckdb::RowGroupCollection_*,_false>._M_head_impl;
  (collection->
  super_unique_ptr<duckdb::RowGroupCollection,_std::default_delete<duckdb::RowGroupCollection>_>).
  _M_t.
  super___uniq_ptr_impl<duckdb::RowGroupCollection,_std::default_delete<duckdb::RowGroupCollection>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::RowGroupCollection_*,_std::default_delete<duckdb::RowGroupCollection>_>
  .super__Head_base<0UL,_duckdb::RowGroupCollection_*,_false>._M_head_impl =
       (RowGroupCollection *)0x0;
  PVar1 = LocalStorage::CreateOptimisticCollection
                    (this_01,this,
                     (unique_ptr<duckdb::RowGroupCollection,_std::default_delete<duckdb::RowGroupCollection>,_true>
                      *)&local_18);
  if (local_18._M_head_impl != (RowGroupCollection *)0x0) {
    ::std::default_delete<duckdb::RowGroupCollection>::operator()
              ((default_delete<duckdb::RowGroupCollection> *)&local_18,local_18._M_head_impl);
  }
  return (PhysicalIndex)PVar1.index;
}

Assistant:

PhysicalIndex DataTable::CreateOptimisticCollection(ClientContext &context, unique_ptr<RowGroupCollection> collection) {
	auto &local_storage = LocalStorage::Get(context, db);
	return local_storage.CreateOptimisticCollection(*this, std::move(collection));
}